

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_EqualsRange<const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::streamReconstructedExpression
          (MatchExpr<FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_EqualsRange<const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *this,ostream *os)

{
  __type_conflict _Var1;
  ostream *poVar2;
  StringRef *in_RSI;
  string matcherAsString;
  FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  StringRef *str;
  ostream *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  MatcherUntypedBase *in_stack_ffffffffffffffb8;
  string local_30 [32];
  StringRef *local_10;
  
  local_10 = in_RSI;
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_(in_stack_ffffffffffffffb8);
  str = local_10;
  Detail::
  stringify<FlatMap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (in_stack_ffffffffffffff88);
  poVar2 = std::operator<<((ostream *)str,(string *)&stack0xffffffffffffffb0);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  _Var1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (_Var1) {
    Catch::operator<<(in_stack_ffffffffffffffa0,str);
  }
  else {
    std::operator<<((ostream *)local_10,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }